

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O2

void __thiscall
RootIndexProxyModelPrivate::onRowsAboutToBeMoved
          (RootIndexProxyModelPrivate *this,QModelIndex *sourceParent,int sourceStart,int sourceEnd,
          QModelIndex *destParent,int dest)

{
  QModelIndex *pQVar1;
  QModelIndex childIdx;
  QModelIndex childIdx_00;
  bool bVar2;
  bool bVar3;
  RootIndexProxyModelPrivate *pRVar4;
  undefined1 local_90 [24];
  undefined1 local_78 [24];
  Data *local_60;
  Connection *pCStack_58;
  QAbstractItemModel *local_50;
  QPersistentModelIndex local_48;
  RootIndexProxyModel *pRStack_40;
  QAbstractItemModel *local_38;
  
  pQVar1 = (QModelIndex *)this->q_ptr;
  bVar2 = ignoreMove(this,sourceParent,destParent);
  if (!bVar2) {
    pRVar4 = (RootIndexProxyModelPrivate *)&stack0xffffffffffffffb8;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)pRVar4,&this->m_rootIndex);
    childIdx.i = (quintptr)pRStack_40;
    childIdx._0_8_ = local_48.d;
    childIdx.m = local_38;
    bVar2 = isDescendant(pRVar4,childIdx,destParent);
    pRVar4 = (RootIndexProxyModelPrivate *)&local_60;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)pRVar4,&this->m_rootIndex);
    childIdx_00.i = (quintptr)pCStack_58;
    childIdx_00._0_8_ = local_60;
    childIdx_00.m = local_50;
    bVar3 = isDescendant(pRVar4,childIdx_00,sourceParent);
    if (bVar2 == bVar3) {
      if (!bVar2) {
        (**(code **)(*(long *)pQVar1 + 0x198))(local_90,pQVar1,sourceParent);
        (**(code **)(*(long *)pQVar1 + 0x198))(local_78,pQVar1,destParent);
        QAbstractItemModel::beginMoveRows
                  (pQVar1,(int)local_90,sourceStart,(QModelIndex *)(ulong)(uint)sourceEnd,
                   (int)local_78);
      }
    }
    else if (bVar2) {
      (**(code **)(*(long *)pQVar1 + 0x198))(local_90,pQVar1,sourceParent);
      QAbstractItemModel::beginRemoveRows(pQVar1,(int)local_90,sourceStart);
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x198))(local_90,pQVar1,destParent);
      QAbstractItemModel::beginInsertRows(pQVar1,(int)local_90,dest);
    }
  }
  return;
}

Assistant:

void RootIndexProxyModelPrivate::onRowsAboutToBeMoved(const QModelIndex &sourceParent, int sourceStart, int sourceEnd, const QModelIndex &destParent,
                                                      int dest)
{
    Q_Q(RootIndexProxyModel);
    Q_ASSERT(!sourceParent.isValid() || sourceParent.model() == q->sourceModel());
    Q_ASSERT(!destParent.isValid() || destParent.model() == q->sourceModel());
    if (ignoreMove(sourceParent, destParent))
        return;
    const bool isDescendantRootDestParent = isDescendant(m_rootIndex, destParent);
    if (isDescendantRootDestParent == isDescendant(m_rootIndex, sourceParent)) {
        if (isDescendantRootDestParent)
            return;
        q->beginMoveRows(q->mapFromSource(sourceParent), sourceStart, sourceEnd, q->mapFromSource(destParent), dest);
    } else if (isDescendantRootDestParent) {

        q->beginRemoveRows(q->mapFromSource(sourceParent), sourceStart, sourceEnd);
    } else {
        q->beginInsertRows(q->mapFromSource(destParent), dest, dest + sourceEnd - sourceStart);
    }
}